

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_4,_4>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_4,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *dst)

{
  float *pfVar1;
  int row_1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_78;
  value_type local_58;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_78);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      local_58.m_data.m_data[3].m_data[0] = 0.0;
      local_58.m_data.m_data[3].m_data[1] = 0.0;
      local_58.m_data.m_data[3].m_data[2] = 0.0;
      local_58.m_data.m_data[3].m_data[3] = 0.0;
      local_58.m_data.m_data[2].m_data[0] = 0.0;
      local_58.m_data.m_data[2].m_data[1] = 0.0;
      local_58.m_data.m_data[2].m_data[2] = 0.0;
      local_58.m_data.m_data[2].m_data[3] = 0.0;
      local_58.m_data.m_data[1].m_data[0] = 0.0;
      local_58.m_data.m_data[1].m_data[1] = 0.0;
      local_58.m_data.m_data[1].m_data[2] = 0.0;
      local_58.m_data.m_data[1].m_data[3] = 0.0;
      local_58.m_data.m_data[0].m_data[0] = 0.0;
      local_58.m_data.m_data[0].m_data[1] = 0.0;
      local_58.m_data.m_data[0].m_data[2] = 0.0;
      local_58.m_data.m_data[0].m_data[3] = 0.0;
      lVar2 = 0;
      lVar3 = 0;
      pfVar1 = (float *)&local_58;
      do {
        lVar4 = 0;
        do {
          if (lVar2 == lVar4) {
            fVar6 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5];
          }
          else {
            fVar6 = 0.0;
          }
          *(float *)((long)pfVar1 + lVar4) = fVar6;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x40);
        lVar3 = lVar3 + 1;
        pfVar1 = pfVar1 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 != 4);
      std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
      emplace_back<tcu::Matrix<float,4,4>>
                ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)dst,
                 &local_58);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar3) = 0;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x40);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 1;
  } while (lVar2 != 4);
  local_58.m_data.m_data[0].m_data[0] = 1.0;
  local_58.m_data.m_data[3].m_data[0] = 1.0;
  local_58.m_data.m_data[2].m_data[1] = 2.0;
  local_58.m_data.m_data[1].m_data[2] = 4.0;
  local_58.m_data.m_data[0].m_data[3] = 8.0;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (dst,&local_58);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}